

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketExtensions.h
# Opt level: O0

int __thiscall uWS::ExtensionsParser::getToken(ExtensionsParser *this,char **in,char *stop)

{
  int iVar1;
  long in_RDX;
  long *in_RSI;
  bool bVar2;
  int hashedToken;
  int local_1c;
  
  while( true ) {
    bVar2 = false;
    if (*in_RSI != in_RDX) {
      iVar1 = isalnum((int)*(char *)*in_RSI);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    *in_RSI = *in_RSI + 1;
  }
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (*in_RSI != in_RDX) {
      iVar1 = isalnum((int)*(char *)*in_RSI);
      bVar2 = true;
      if ((iVar1 == 0) && (bVar2 = true, *(char *)*in_RSI != '-')) {
        bVar2 = *(char *)*in_RSI == '_';
      }
    }
    if (!bVar2) break;
    iVar1 = isdigit((int)*(char *)*in_RSI);
    if (iVar1 == 0) {
      local_1c = *(char *)*in_RSI + local_1c;
    }
    else if ((-0x8000 < local_1c) && (local_1c < 0x7fff)) {
      local_1c = local_1c * 10 - (*(char *)*in_RSI + -0x30);
    }
    *in_RSI = *in_RSI + 1;
  }
  return local_1c;
}

Assistant:

int getToken(const char *&in, const char *stop) {
        while (in != stop && !isalnum(*in)) {
            in++;
        }

        /* Don't care more than this for now */
        static_assert(SHRT_MIN > INT_MIN, "Integer overflow fix is invalid for this platform, report this as a bug!");

        int hashedToken = 0;
        while (in != stop && (isalnum(*in) || *in == '-' || *in == '_')) {
            if (isdigit(*in)) {
                /* This check is a quick and incorrect fix for integer overflow
                 * in oss-fuzz but we don't care as it doesn't matter either way */
                if (hashedToken > SHRT_MIN && hashedToken < SHRT_MAX) {
                    hashedToken = hashedToken * 10 - (*in - '0');
                }
            } else {
                hashedToken += *in;
            }
            in++;
        }
        return hashedToken;
    }